

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

Uint32 Diligent::PipelineStateUtils::GetRenderTargetMask(GraphicsPipelineDesc *GraphicsPipeline)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  if ((ulong)GraphicsPipeline->NumRenderTargets != 0) {
    uVar2 = 0;
    lVar3 = 0xb;
    uVar1 = 0;
    do {
      if ((GraphicsPipeline->RTVFormats[uVar2] != TEX_FORMAT_UNKNOWN) &&
         (*(char *)((long)(GraphicsPipeline->BlendDesc).RenderTargets + lVar3 + -2) != '\0')) {
        uVar1 = uVar1 | 1 << ((uint)uVar2 & 0x1f);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 10;
    } while (GraphicsPipeline->NumRenderTargets != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

Uint32 GetRenderTargetMask(const GraphicsPipelineDesc& GraphicsPipeline) noexcept
{
    Uint32 RTMask = 0;
    for (Uint32 rt = 0; rt < GraphicsPipeline.NumRenderTargets; ++rt)
    {
        if (GraphicsPipeline.RTVFormats[rt] != TEX_FORMAT_UNKNOWN &&
            GraphicsPipeline.BlendDesc.RenderTargets[rt].RenderTargetWriteMask != COLOR_MASK_NONE)
        {
            RTMask |= (1u << rt);
        }
    }
    return RTMask;
}